

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O3

Dim * __thiscall
cnn::PickNegLogSoftmax::dim_forward
          (Dim *__return_storage_ptr__,PickNegLogSoftmax *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  pointer pDVar1;
  invalid_argument *this_00;
  ulong uVar2;
  ostringstream s;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pDVar1 != 0x24) {
    __assert_fail("xs.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/nodes-common.cc"
                  ,0x298,
                  "virtual Dim cnn::PickNegLogSoftmax::dim_forward(const vector<Dim> &) const");
  }
  if (1 < (ulong)pDVar1->nd) {
    uVar2 = 1;
    do {
      if (pDVar1->d[uVar2] != 1) {
        std::__cxx11::ostringstream::ostringstream(local_190);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_190,"Bad input dimensions in PickNegLogSoftmax: ",0x2b);
        operator<<((ostream *)local_190,xs);
        this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::invalid_argument::invalid_argument(this_00,local_1b0);
        __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      uVar2 = uVar2 + 1;
    } while (pDVar1->nd != uVar2);
  }
  __return_storage_ptr__->bd = pDVar1->bd;
  __return_storage_ptr__->nd = 1;
  __return_storage_ptr__->d[0] = 1;
  return __return_storage_ptr__;
}

Assistant:

string LogisticSigmoid::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "\\sigma(" << arg_names[0] << ')';
  return s.str();
}